

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty(void)

{
  ulong uVar1;
  bool bVar2;
  ResultType RVar3;
  ModelDescription *interface;
  FunctionDescription *pFVar4;
  FeatureDescription *pFVar5;
  ostream *poVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  int iVar9;
  char *pcVar10;
  ValidationPolicy local_74;
  undefined1 local_70 [40];
  Model m;
  
  CoreML::Specification::Model::Model(&m);
  local_74.allowsEmptyInput = true;
  local_74.allowsEmptyOutput = true;
  local_74.allowsMultipleFunctions = true;
  local_74.allowsStatefulPrediction = false;
  interface = CoreML::Specification::Model::_internal_mutable_description(&m);
  uVar1 = (interface->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&interface->defaultfunctionname_,"foo",puVar8);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FunctionDescription>::Add
                     (&interface->functions_);
  uVar1 = (pFVar4->super_MessageLite)._internal_metadata_.ptr_;
  puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar4->name_,"foo",puVar8);
  CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
  bVar2 = CoreML::Result::good((Result *)local_70);
  std::__cxx11::string::~string((string *)(local_70 + 8));
  if (bVar2) {
    pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                       (&interface->input_);
    uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar8 = (undefined8 *)*puVar8;
    }
    google::protobuf::internal::ArenaStringPtr::
    Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"x",puVar8);
    CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
    bVar2 = CoreML::Result::good((Result *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar7 = (ostream *)std::operator<<(poVar6,":");
      iVar9 = 0x14c;
LAB_00138678:
      poVar6 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
      poVar6 = std::operator<<(poVar6,": error: ");
      pcVar10 = 
      "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy))).good())"
      ;
    }
    else {
      CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
      RVar3 = CoreML::Result::type((Result *)local_70);
      std::__cxx11::string::~string((string *)(local_70 + 8));
      if (RVar3 == INVALID_MODEL_INTERFACE) {
        google::protobuf::internal::RepeatedPtrFieldBase::
        Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                  (&(interface->input_).super_RepeatedPtrFieldBase);
        pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                           (&interface->output_);
        uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
        puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
        if ((uVar1 & 1) != 0) {
          puVar8 = (undefined8 *)*puVar8;
        }
        google::protobuf::internal::ArenaStringPtr::
        Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"y",puVar8);
        CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
        bVar2 = CoreML::Result::good((Result *)local_70);
        std::__cxx11::string::~string((string *)(local_70 + 8));
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar7 = (ostream *)std::operator<<(poVar6,":");
          iVar9 = 0x150;
          goto LAB_00138678;
        }
        CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
        RVar3 = CoreML::Result::type((Result *)local_70);
        std::__cxx11::string::~string((string *)(local_70 + 8));
        if (RVar3 == INVALID_MODEL_INTERFACE) {
          google::protobuf::internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                    (&(interface->output_).super_RepeatedPtrFieldBase);
          pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                   Add(&interface->traininginput_);
          uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
          puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
          if ((uVar1 & 1) != 0) {
            puVar8 = (undefined8 *)*puVar8;
          }
          google::protobuf::internal::ArenaStringPtr::
          Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"z",puVar8);
          CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
          bVar2 = CoreML::Result::good((Result *)local_70);
          std::__cxx11::string::~string((string *)(local_70 + 8));
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar7 = (ostream *)std::operator<<(poVar6,":");
            iVar9 = 0x154;
            goto LAB_00138678;
          }
          CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
          RVar3 = CoreML::Result::type((Result *)local_70);
          std::__cxx11::string::~string((string *)(local_70 + 8));
          if (RVar3 == INVALID_MODEL_INTERFACE) {
            google::protobuf::internal::RepeatedPtrFieldBase::
            Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(interface->traininginput_).super_RepeatedPtrFieldBase);
            pFVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                     Add(&interface->state_);
            uVar1 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
            puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
            if ((uVar1 & 1) != 0) {
              puVar8 = (undefined8 *)*puVar8;
            }
            google::protobuf::internal::ArenaStringPtr::
            Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar5->name_,"s",puVar8)
            ;
            CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
            bVar2 = CoreML::Result::good((Result *)local_70);
            std::__cxx11::string::~string((string *)(local_70 + 8));
            if (bVar2) {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                      );
              poVar7 = (ostream *)std::operator<<(poVar6,":");
              iVar9 = 0x158;
              goto LAB_00138678;
            }
            CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
            RVar3 = CoreML::Result::type((Result *)local_70);
            std::__cxx11::string::~string((string *)(local_70 + 8));
            if (RVar3 == INVALID_MODEL_INTERFACE) {
              google::protobuf::internal::RepeatedPtrFieldBase::
              Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                        (&(interface->state_).super_RepeatedPtrFieldBase);
              uVar1 = (interface->super_MessageLite)._internal_metadata_.ptr_;
              puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
              if ((uVar1 & 1) != 0) {
                puVar8 = (undefined8 *)*puVar8;
              }
              google::protobuf::internal::ArenaStringPtr::
              Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                        (&interface->predictedfeaturename_,"f",puVar8);
              CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
              bVar2 = CoreML::Result::good((Result *)local_70);
              std::__cxx11::string::~string((string *)(local_70 + 8));
              if (bVar2) {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                        );
                poVar7 = (ostream *)std::operator<<(poVar6,":");
                iVar9 = 0x15c;
                goto LAB_00138678;
              }
              CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
              RVar3 = CoreML::Result::type((Result *)local_70);
              std::__cxx11::string::~string((string *)(local_70 + 8));
              if (RVar3 == INVALID_MODEL_INTERFACE) {
                google::protobuf::internal::ArenaStringPtr::ClearToEmpty
                          (&interface->predictedfeaturename_);
                uVar1 = (interface->super_MessageLite)._internal_metadata_.ptr_;
                puVar8 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
                if ((uVar1 & 1) != 0) {
                  puVar8 = (undefined8 *)*puVar8;
                }
                google::protobuf::internal::ArenaStringPtr::
                Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
                          (&interface->predictedprobabilitiesname_,"f",puVar8);
                CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
                bVar2 = CoreML::Result::good((Result *)local_70);
                std::__cxx11::string::~string((string *)(local_70 + 8));
                if (bVar2) {
                  poVar6 = std::operator<<((ostream *)&std::cout,
                                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                          );
                  poVar7 = (ostream *)std::operator<<(poVar6,":");
                  iVar9 = 0x160;
                  goto LAB_00138678;
                }
                CoreML::validateModelDescription((Result *)local_70,interface,9,&local_74);
                RVar3 = CoreML::Result::type((Result *)local_70);
                std::__cxx11::string::~string((string *)(local_70 + 8));
                if (RVar3 == INVALID_MODEL_INTERFACE) {
                  iVar9 = 0;
                  google::protobuf::internal::ArenaStringPtr::ClearToEmpty
                            (&interface->predictedprobabilitiesname_);
                  goto LAB_0013881e;
                }
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                        );
                poVar7 = (ostream *)std::operator<<(poVar6,":");
                iVar9 = 0x160;
              }
              else {
                poVar6 = std::operator<<((ostream *)&std::cout,
                                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                        );
                poVar7 = (ostream *)std::operator<<(poVar6,":");
                iVar9 = 0x15c;
              }
            }
            else {
              poVar6 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                      );
              poVar7 = (ostream *)std::operator<<(poVar6,":");
              iVar9 = 0x158;
            }
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                    );
            poVar7 = (ostream *)std::operator<<(poVar6,":");
            iVar9 = 0x154;
          }
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                  );
          poVar7 = (ostream *)std::operator<<(poVar6,":");
          iVar9 = 0x150;
        }
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                                );
        poVar7 = (ostream *)std::operator<<(poVar6,":");
        iVar9 = 0x14c;
      }
      poVar6 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
      poVar6 = std::operator<<(poVar6,": error: ");
      pcVar10 = 
      "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).type())"
      ;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,0x149);
    poVar6 = std::operator<<(poVar6,": error: ");
    pcVar10 = 
    "(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy)).good()"
    ;
  }
  poVar6 = std::operator<<(poVar6,pcVar10);
  poVar6 = std::operator<<(poVar6," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar6);
  iVar9 = 1;
LAB_0013881e:
  CoreML::Specification::Model::~Model(&m);
  return iVar9;
}

Assistant:

int testMultiFunctionTopLevelFeatureDescriptionsMustBeEmpty() {
    Specification::Model m;

    auto validationPolicy = ValidationPolicy();
    validationPolicy.allowsEmptyInput = true;
    validationPolicy.allowsEmptyOutput = true;
    validationPolicy.allowsMultipleFunctions = true;

    auto *description = m.mutable_description();
    description->set_defaultfunctionname("foo");
    auto *function = description->add_functions();
    function->set_name("foo");

    ML_ASSERT_GOOD(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy));

    description->add_input()->set_name("x");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_input();

    description->add_output()->set_name("y");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_output();

    description->add_traininginput()->set_name("z");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_traininginput();

    description->add_state()->set_name("s");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_state();

    description->set_predictedfeaturename("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedfeaturename();

    description->set_predictedprobabilitiesname("f");
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_IOS18, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);
    description->clear_predictedprobabilitiesname();

    return 0;
}